

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuBackend.cpp
# Opt level: O0

Value __thiscall xmrig::CpuBackend::toJSON(CpuBackend *this,Document *doc)

{
  undefined1 uVar1;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  AlgoVariant AVar5;
  Config *this_00;
  CpuBackendPrivate *this_01;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator_00;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  undefined8 extraout_RDX_01;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  Document *in_RDI;
  undefined1 auVar7 [16];
  Value VVar8;
  Value thread;
  CpuLaunchData *data;
  iterator __end1;
  iterator __begin1;
  vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *__range1;
  size_t i;
  Value threads;
  CpuConfig *cpu;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined4 in_stack_fffffffffffffdf8;
  Type in_stack_fffffffffffffdfc;
  CpuConfig *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  String *in_stack_fffffffffffffe18;
  GenericStringRef<char> *this_02;
  CpuBackendPrivate *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe48;
  undefined2 in_stack_fffffffffffffe4c;
  undefined1 in_stack_fffffffffffffe4e;
  undefined1 in_stack_fffffffffffffe4f;
  Document *doc_00;
  Document *in_stack_fffffffffffffe70;
  Document *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  GenericStringRef<char> local_170;
  GenericStringRef<char> local_160;
  GenericStringRef<char> local_150;
  GenericStringRef<char> local_140;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_130;
  reference local_120;
  CpuLaunchData *local_118;
  __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
  local_110;
  Ch *local_108;
  long local_100;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_f8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_e8;
  GenericStringRef<char> local_d8;
  undefined4 local_c4;
  GenericStringRef<char> local_c0;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_b0;
  GenericStringRef<char> local_a0;
  GenericStringRef<char> local_90;
  GenericStringRef<char> local_80;
  GenericStringRef<char> local_70 [2];
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_50;
  GenericStringRef<char> local_40;
  byte local_29;
  CpuConfig *local_28;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *local_20;
  
  doc_00 = in_RDI;
  local_20 = rapidjson::
             GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
             ::GetAllocator(in_RDX);
  this_00 = Base::config(*(Base **)(in_RSI->data_).s.str);
  local_28 = Config::cpu(this_00);
  local_29 = 0;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_40,(char (*) [5])0x27c7ac);
  this_01 = (CpuBackendPrivate *)(**(code **)((in_RSI->data_).n.i64 + 0x28))();
  String::toJSON(in_stack_fffffffffffffe18);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_RSI,(StringRefType *)doc_00,
            &in_RDI->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             CONCAT17(in_stack_fffffffffffffe4f,
                      CONCAT16(in_stack_fffffffffffffe4e,
                               CONCAT24(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48))));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_50);
  rapidjson::GenericStringRef<char>::GenericStringRef<8u>(local_70,(char (*) [8])0x279127);
  uVar1 = (**(code **)((in_RSI->data_).n.i64 + 0x10))();
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_RSI,(StringRefType *)doc_00,SUB81((ulong)in_RDI >> 0x38,0),
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                  CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffe4e,
                                          CONCAT24(in_stack_fffffffffffffe4c,
                                                   in_stack_fffffffffffffe48))));
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_80,(char (*) [7])"hw-aes");
  uVar2 = CpuConfig::isHwAES(in_stack_fffffffffffffe00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>(in_RSI,(StringRefType *)doc_00,SUB81((ulong)in_RDI >> 0x38,0),
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                  CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,
                                                         in_stack_fffffffffffffe48))));
  rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_90,(char (*) [9])0x27917c);
  iVar4 = CpuConfig::priority(local_28);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(in_RSI,(StringRefType *)doc_00,(int)((ulong)in_RDI >> 0x20),
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
  rapidjson::GenericStringRef<char>::GenericStringRef<10u>(&local_a0,(char (*) [10])"hugepages");
  CpuBackendPrivate::hugePages(this_01,(int)((ulong)in_RSI >> 0x20),doc_00);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember(in_RSI,(StringRefType *)doc_00,
            &in_RDI->
             super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue(&local_b0);
  rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_c0,(char (*) [7])"memory");
  CpuBackendPrivate::ways(in_stack_fffffffffffffe20);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_long>
            (in_RSI,(StringRefType *)doc_00,(unsigned_long)in_RDI,
             (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
             CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
  bVar3 = std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::empty
                    ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                     CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  uVar6 = extraout_RDX;
  if (!bVar3) {
    auVar7 = (**(code **)((in_RSI->data_).n.i64 + 0x20))();
    uVar6 = auVar7._8_8_;
    if (auVar7._0_8_ != 0) {
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_d8,(char (*) [9])"hashrate");
      (**(code **)((in_RSI->data_).n.i64 + 0x20))();
      Hashrate::toJSON((Hashrate *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_RSI,(StringRefType *)doc_00,
                  &in_RDI->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_e8);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
      local_100 = 0;
      local_108 = (in_RSI->data_).s.str + 0x48;
      local_110._M_current =
           (CpuLaunchData *)
           std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::begin
                     ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                      CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      local_118 = (CpuLaunchData *)
                  std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>::end
                            ((vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_> *)
                             CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
                            *)in_stack_fffffffffffffe00,
                           (__normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
                            *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        if (!bVar3) break;
        local_120 = __gnu_cxx::
                    __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
                    ::operator*(&local_110);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
        rapidjson::GenericStringRef<char>::GenericStringRef<10u>
                  (&local_140,(char (*) [10])"intensity");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>
                  (in_RSI,(StringRefType *)doc_00,(uint)((ulong)in_RDI >> 0x20),
                   (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
        this_02 = &local_150;
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>(this_02,(char (*) [9])0x27916f);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<long>(in_RSI,(StringRefType *)doc_00,(long)in_RDI,
                          (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                          CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))))
        ;
        rapidjson::GenericStringRef<char>::GenericStringRef<3u>(&local_160,(char (*) [3])"av");
        AVar5 = CpuLaunchData::av(local_120);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<xmrig::CnHash::AlgoVariant>
                  (in_RSI,(StringRefType *)doc_00,(AlgoVariant)((ulong)in_RDI >> 0x20),
                   (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
        rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_170,(char (*) [9])"hashrate")
        ;
        allocator_00 = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                       (**(code **)((in_RSI->data_).n.i64 + 0x20))();
        Hashrate::toJSON((Hashrate *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                         in_stack_fffffffffffffe78);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(in_RSI,(StringRefType *)doc_00,
                    &in_RDI->
                     super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    ,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                     CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)&stack0xfffffffffffffe80);
        local_100 = local_100 + 1;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)this_02,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)CONCAT44(AVar5,in_stack_fffffffffffffe10),allocator_00);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue(&local_130);
        __gnu_cxx::
        __normal_iterator<xmrig::CpuLaunchData_*,_std::vector<xmrig::CpuLaunchData,_std::allocator<xmrig::CpuLaunchData>_>_>
        ::operator++(&local_110);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<8u>
                ((GenericStringRef<char> *)&stack0xfffffffffffffe70,(char (*) [8])"threads");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(in_RSI,(StringRefType *)doc_00,
                  &in_RDI->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                   CONCAT17(uVar1,CONCAT16(uVar2,CONCAT24(in_stack_fffffffffffffe4c,iVar4))));
      local_29 = 1;
      local_c4 = 1;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue(&local_f8);
      uVar6 = extraout_RDX_00;
      goto LAB_001ff403;
    }
  }
  local_29 = 1;
  local_c4 = 1;
LAB_001ff403:
  if ((local_29 & 1) == 0) {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&doc_00->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 );
    uVar6 = extraout_RDX_01;
  }
  VVar8.data_.s.str = (Ch *)uVar6;
  VVar8.data_.n = (Number)in_RDI;
  return (Value)VVar8.data_;
}

Assistant:

rapidjson::Value xmrig::CpuBackend::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator         = doc.GetAllocator();
    const CpuConfig &cpu    = d_ptr->controller->config()->cpu();

    Value out(kObjectType);
    out.AddMember("type",       type().toJSON(), allocator);
    out.AddMember("enabled",    isEnabled(), allocator);
    out.AddMember("hw-aes",     cpu.isHwAES(), allocator);
    out.AddMember("priority",   cpu.priority(), allocator);

    out.AddMember("hugepages", d_ptr->hugePages(2, doc), allocator);
    out.AddMember("memory",    static_cast<uint64_t>(d_ptr->ways() * CnAlgo::CN_MEMORY), allocator);

    if (d_ptr->threads.empty() || !hashrate()) {
        return out;
    }

    out.AddMember("hashrate", hashrate()->toJSON(doc), allocator);

    Value threads(kArrayType);

    size_t i = 0;
    for (const CpuLaunchData &data : d_ptr->threads) {
        Value thread(kObjectType);
        thread.AddMember("intensity",   data.intensity, allocator);
        thread.AddMember("affinity",    data.affinity, allocator);
        thread.AddMember("av",          data.av(), allocator);
        thread.AddMember("hashrate",    hashrate()->toJSON(i, doc), allocator);

        i++;
        threads.PushBack(thread, allocator);
    }

    out.AddMember("threads", threads, allocator);

    return out;
}